

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

result<toml::basic_value<toml::type_config>,_toml::error_info> *
toml::detail::parse_array<toml::type_config>(location *loc,context<toml::type_config> *ctx)

{
  array_format_info fmt_00;
  undefined8 uVar1;
  bool bVar2;
  char_type_conflict cVar3;
  vector<toml::error_info,_std::allocator<toml::error_info>_> *pvVar4;
  multiline_spacer<toml::type_config> *pmVar5;
  size_type sVar6;
  comment_type *pcVar7;
  error_info *peVar8;
  success_type *psVar9;
  basic_value<toml::type_config> *in_RDX;
  location *in_RSI;
  result<toml::basic_value<toml::type_config>,_toml::error_info> *in_RDI;
  source_location src_2;
  size_t before_skip;
  bool comment_found;
  result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
  com_res;
  size_t i;
  type elem;
  result<toml::basic_value<toml::type_config>,_toml::error_info> elem_res;
  source_location src_1;
  bool comma_found;
  optional<toml::detail::multiline_spacer<toml::type_config>_> spacer;
  array_format_info fmt;
  array_type val;
  source_location src;
  location first;
  size_type num_errors;
  value_type *in_stack_fffffffffffff058;
  success_type *s;
  result<toml::basic_value<toml::type_config>,_toml::error_info> *in_stack_fffffffffffff060;
  size_t in_stack_fffffffffffff068;
  location *in_stack_fffffffffffff070;
  undefined7 in_stack_fffffffffffff078;
  undefined1 in_stack_fffffffffffff07f;
  error_info *in_stack_fffffffffffff080;
  basic_value<toml::type_config> *in_stack_fffffffffffff088;
  basic_value<toml::type_config> *in_stack_fffffffffffff090;
  error_type *in_stack_fffffffffffff098;
  multiline_spacer<toml::type_config> *in_stack_fffffffffffff0a0;
  result<toml::basic_value<toml::type_config>,_toml::error_info> *in_stack_fffffffffffff0b8;
  source_location in_stack_fffffffffffff0c0;
  undefined7 in_stack_fffffffffffff0c8;
  undefined1 in_stack_fffffffffffff0cf;
  basic_value<toml::type_config> *in_stack_fffffffffffff0d0;
  region *in_stack_fffffffffffff0d8;
  basic_value<toml::type_config> *in_stack_fffffffffffff0e0;
  reference in_stack_fffffffffffff0f8;
  int32_t in_stack_fffffffffffff100;
  basic_value<toml::type_config> *in_stack_fffffffffffff148;
  string *in_stack_fffffffffffff218;
  source_location *in_stack_fffffffffffff220;
  string *in_stack_fffffffffffff228;
  undefined1 in_stack_fffffffffffff35f;
  context<toml::type_config> *in_stack_fffffffffffff360;
  location *in_stack_fffffffffffff368;
  allocator<char> local_b81 [49];
  context<toml::type_config> *in_stack_fffffffffffff4b0;
  location *in_stack_fffffffffffff4b8;
  location local_ae1 [3];
  context<toml::type_config> *in_stack_fffffffffffff630;
  location *in_stack_fffffffffffff638;
  basic_value<toml::type_config> local_920;
  result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
  local_828;
  undefined1 local_7b8 [360];
  result local_650 [215];
  allocator<char> local_579 [160];
  allocator<char> local_4d9 [440];
  byte local_321;
  array_format_info local_2f4 [3];
  int local_2d0;
  allocator<char> local_2c9 [160];
  allocator<char> local_229 [521];
  success_type *local_20;
  basic_value<toml::type_config> *local_18;
  location *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  pvVar4 = context<toml::type_config>::errors((context<toml::type_config> *)in_RDX);
  local_20 = (success_type *)
             std::vector<toml::error_info,_std::allocator<toml::error_info>_>::size(pvVar4);
  location::location((location *)in_stack_fffffffffffff080,
                     (location *)CONCAT17(in_stack_fffffffffffff07f,in_stack_fffffffffffff078));
  bVar2 = location::eof((location *)in_stack_fffffffffffff060);
  if ((bVar2) || (cVar3 = location::current((location *)in_stack_fffffffffffff058), cVar3 != '[')) {
    region::region((region *)in_stack_fffffffffffff0d0,
                   (location *)CONCAT17(in_stack_fffffffffffff0cf,in_stack_fffffffffffff0c8));
    source_location::source_location
              ((source_location *)in_stack_fffffffffffff0e0,in_stack_fffffffffffff0d8);
    region::~region((region *)in_stack_fffffffffffff060);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff0a0,(char *)in_stack_fffffffffffff098,
               (allocator<char> *)in_stack_fffffffffffff090);
    source_location::source_location
              ((source_location *)in_stack_fffffffffffff060,
               (source_location *)in_stack_fffffffffffff058);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff0a0,(char *)in_stack_fffffffffffff098,
               (allocator<char> *)in_stack_fffffffffffff090);
    make_error_info<>(in_stack_fffffffffffff228,in_stack_fffffffffffff220,in_stack_fffffffffffff218)
    ;
    err<toml::error_info>((error_info *)in_stack_fffffffffffff0b8);
    result<toml::basic_value<toml::type_config>,_toml::error_info>::result
              (in_stack_fffffffffffff060,(failure_type *)in_stack_fffffffffffff058);
    failure<toml::error_info>::~failure((failure<toml::error_info> *)0x66a1bc);
    error_info::~error_info((error_info *)in_stack_fffffffffffff060);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff060);
    std::allocator<char>::~allocator(local_2c9);
    source_location::~source_location((source_location *)in_stack_fffffffffffff060);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff060);
    std::allocator<char>::~allocator(local_229);
    local_2d0 = 1;
    source_location::~source_location((source_location *)in_stack_fffffffffffff060);
  }
  else {
    location::advance(in_stack_fffffffffffff070,in_stack_fffffffffffff068);
    std::
    vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
    ::vector((vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
              *)0x66a34b);
    array_format_info::array_format_info(local_2f4);
    local_2f4[0].fmt = oneline;
    local_2f4[0].indent_type = none;
    skip_multiline_spacer<toml::type_config>
              (in_stack_fffffffffffff368,in_stack_fffffffffffff360,(bool)in_stack_fffffffffffff35f);
    bVar2 = std::optional<toml::detail::multiline_spacer<toml::type_config>_>::has_value
                      ((optional<toml::detail::multiline_spacer<toml::type_config>_> *)0x66a396);
    if ((bVar2) &&
       (pmVar5 = std::optional<toml::detail::multiline_spacer<toml::type_config>_>::value
                           ((optional<toml::detail::multiline_spacer<toml::type_config>_> *)
                            in_stack_fffffffffffff060), (pmVar5->newline_found & 1U) != 0)) {
      local_2f4[0].fmt = multiline;
    }
    local_321 = 1;
    while (bVar2 = location::eof((location *)in_stack_fffffffffffff060), ((bVar2 ^ 0xffU) & 1) != 0)
    {
      cVar3 = location::current((location *)in_stack_fffffffffffff058);
      if (cVar3 == ']') {
        bVar2 = std::optional<toml::detail::multiline_spacer<toml::type_config>_>::has_value
                          ((optional<toml::detail::multiline_spacer<toml::type_config>_> *)0x66a452)
        ;
        if (((bVar2) &&
            (pmVar5 = std::optional<toml::detail::multiline_spacer<toml::type_config>_>::value
                                ((optional<toml::detail::multiline_spacer<toml::type_config>_> *)
                                 in_stack_fffffffffffff060), (pmVar5->newline_found & 1U) != 0)) &&
           (pmVar5 = std::optional<toml::detail::multiline_spacer<toml::type_config>_>::value
                               ((optional<toml::detail::multiline_spacer<toml::type_config>_> *)
                                in_stack_fffffffffffff060), pmVar5->indent_type != none)) {
          pmVar5 = std::optional<toml::detail::multiline_spacer<toml::type_config>_>::value
                             ((optional<toml::detail::multiline_spacer<toml::type_config>_> *)
                              in_stack_fffffffffffff060);
          local_2f4[0].indent_type = pmVar5->indent_type;
          pmVar5 = std::optional<toml::detail::multiline_spacer<toml::type_config>_>::value
                             ((optional<toml::detail::multiline_spacer<toml::type_config>_> *)
                              in_stack_fffffffffffff060);
          local_2f4[0].closing_indent = pmVar5->indent;
        }
        break;
      }
      if ((local_321 & 1) == 0) {
        region::region((region *)in_stack_fffffffffffff0d0,
                       (location *)CONCAT17(in_stack_fffffffffffff0cf,in_stack_fffffffffffff0c8));
        source_location::source_location
                  ((source_location *)in_stack_fffffffffffff0e0,in_stack_fffffffffffff0d8);
        region::~region((region *)in_stack_fffffffffffff060);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff0a0,(char *)in_stack_fffffffffffff098,
                   (allocator<char> *)in_stack_fffffffffffff090);
        source_location::source_location
                  ((source_location *)in_stack_fffffffffffff060,
                   (source_location *)in_stack_fffffffffffff058);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff0a0,(char *)in_stack_fffffffffffff098,
                   (allocator<char> *)in_stack_fffffffffffff090);
        make_error_info<>(in_stack_fffffffffffff228,in_stack_fffffffffffff220,
                          in_stack_fffffffffffff218);
        err<toml::error_info>((error_info *)in_stack_fffffffffffff0b8);
        result<toml::basic_value<toml::type_config>,_toml::error_info>::result
                  (in_stack_fffffffffffff060,(failure_type *)in_stack_fffffffffffff058);
        failure<toml::error_info>::~failure((failure<toml::error_info> *)0x66a627);
        error_info::~error_info((error_info *)in_stack_fffffffffffff060);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff060);
        std::allocator<char>::~allocator(local_579);
        source_location::~source_location((source_location *)in_stack_fffffffffffff060);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff060);
        std::allocator<char>::~allocator(local_4d9);
        local_2d0 = 1;
        source_location::~source_location((source_location *)in_stack_fffffffffffff060);
        goto LAB_0066b431;
      }
      bVar2 = std::optional<toml::detail::multiline_spacer<toml::type_config>_>::has_value
                        ((optional<toml::detail::multiline_spacer<toml::type_config>_> *)0x66a78b);
      if (((bVar2) &&
          (pmVar5 = std::optional<toml::detail::multiline_spacer<toml::type_config>_>::value
                              ((optional<toml::detail::multiline_spacer<toml::type_config>_> *)
                               in_stack_fffffffffffff060), (pmVar5->newline_found & 1U) != 0)) &&
         (in_stack_fffffffffffff148 =
               (basic_value<toml::type_config> *)
               std::optional<toml::detail::multiline_spacer<toml::type_config>_>::value
                         ((optional<toml::detail::multiline_spacer<toml::type_config>_> *)
                          in_stack_fffffffffffff060), in_stack_fffffffffffff148->field_0x1 != none))
      {
        pmVar5 = std::optional<toml::detail::multiline_spacer<toml::type_config>_>::value
                           ((optional<toml::detail::multiline_spacer<toml::type_config>_> *)
                            in_stack_fffffffffffff060);
        local_2f4[0].indent_type = pmVar5->indent_type;
        pmVar5 = std::optional<toml::detail::multiline_spacer<toml::type_config>_>::value
                           ((optional<toml::detail::multiline_spacer<toml::type_config>_> *)
                            in_stack_fffffffffffff060);
        local_2f4[0].body_indent = pmVar5->indent;
      }
      parse_value<toml::type_config>(in_stack_fffffffffffff638,in_stack_fffffffffffff630);
      bVar2 = toml::result::operator_cast_to_bool(local_650);
      if (bVar2) {
        local_7b8._152_8_ = &PTR_s__workspace_llm4binary_github_lic_00933388;
        result<toml::basic_value<toml::type_config>,_toml::error_info>::unwrap
                  (in_stack_fffffffffffff0b8,in_stack_fffffffffffff0c0);
        basic_value<toml::type_config>::basic_value
                  (in_stack_fffffffffffff090,in_stack_fffffffffffff088);
        bVar2 = std::optional<toml::detail::multiline_spacer<toml::type_config>_>::has_value
                          ((optional<toml::detail::multiline_spacer<toml::type_config>_> *)0x66a8b6)
        ;
        if (bVar2) {
          std::optional<toml::detail::multiline_spacer<toml::type_config>_>::value
                    ((optional<toml::detail::multiline_spacer<toml::type_config>_> *)
                     in_stack_fffffffffffff060);
          basic_value<toml::type_config>::comments
                    ((basic_value<toml::type_config> *)(local_7b8 + 0xa0));
          preserve_comments::operator=
                    ((preserve_comments *)in_stack_fffffffffffff060,
                     (preserve_comments *)in_stack_fffffffffffff058);
        }
        skip_multiline_spacer<toml::type_config>
                  (in_stack_fffffffffffff368,in_stack_fffffffffffff360,
                   (bool)in_stack_fffffffffffff35f);
        std::optional<toml::detail::multiline_spacer<toml::type_config>_>::operator=
                  ((optional<toml::detail::multiline_spacer<toml::type_config>_> *)
                   in_stack_fffffffffffff060,
                   (optional<toml::detail::multiline_spacer<toml::type_config>_> *)
                   in_stack_fffffffffffff058);
        std::optional<toml::detail::multiline_spacer<toml::type_config>_>::~optional
                  ((optional<toml::detail::multiline_spacer<toml::type_config>_> *)0x66a97b);
        bVar2 = std::optional<toml::detail::multiline_spacer<toml::type_config>_>::has_value
                          ((optional<toml::detail::multiline_spacer<toml::type_config>_> *)0x66a988)
        ;
        if (bVar2) {
          local_7b8._104_8_ = 0;
          while( true ) {
            uVar1 = local_7b8._104_8_;
            std::optional<toml::detail::multiline_spacer<toml::type_config>_>::value
                      ((optional<toml::detail::multiline_spacer<toml::type_config>_> *)
                       in_stack_fffffffffffff060);
            sVar6 = preserve_comments::size((preserve_comments *)0x66a9d5);
            if (sVar6 <= (ulong)uVar1) break;
            pcVar7 = basic_value<toml::type_config>::comments
                               ((basic_value<toml::type_config> *)(local_7b8 + 0xa0));
            in_stack_fffffffffffff100 = (int32_t)pcVar7;
            std::optional<toml::detail::multiline_spacer<toml::type_config>_>::value
                      ((optional<toml::detail::multiline_spacer<toml::type_config>_> *)
                       in_stack_fffffffffffff060);
            in_stack_fffffffffffff0f8 =
                 preserve_comments::at_abi_cxx11_
                           ((preserve_comments *)in_stack_fffffffffffff060,
                            (size_type)in_stack_fffffffffffff058);
            preserve_comments::push_back
                      ((preserve_comments *)in_stack_fffffffffffff060,
                       (string *)in_stack_fffffffffffff058);
            local_7b8._104_8_ = local_7b8._104_8_ + 1;
          }
          pmVar5 = std::optional<toml::detail::multiline_spacer<toml::type_config>_>::value
                             ((optional<toml::detail::multiline_spacer<toml::type_config>_> *)
                              in_stack_fffffffffffff060);
          if ((pmVar5->newline_found & 1U) != 0) {
            local_2f4[0].fmt = multiline;
          }
        }
        character::character
                  ((character *)in_stack_fffffffffffff060,
                   (char_type)((ulong)in_stack_fffffffffffff058 >> 0x38));
        character::scan((character *)in_stack_fffffffffffff0d8,(location *)in_stack_fffffffffffff0d0
                       );
        in_stack_fffffffffffff0e0 = (basic_value<toml::type_config> *)local_7b8;
        local_321 = region::is_ok((region *)0x66aae6);
        region::~region((region *)in_stack_fffffffffffff060);
        character::~character((character *)0x66ab07);
        parse_comment_line<toml::type_config>(in_stack_fffffffffffff4b8,in_stack_fffffffffffff4b0);
        bVar2 = result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
                ::is_err(&local_828);
        if (bVar2) {
          local_920.region_.last_ = (size_t)&PTR_s__workspace_llm4binary_github_lic_009333a0;
          in_stack_fffffffffffff0d0 = local_18;
          in_stack_fffffffffffff0d8 =
               (region *)
               result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
               ::unwrap_err((result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
                             *)in_stack_fffffffffffff0b8,in_stack_fffffffffffff0c0);
          error_info::error_info
                    (in_stack_fffffffffffff080,
                     (error_info *)CONCAT17(in_stack_fffffffffffff07f,in_stack_fffffffffffff078));
          context<toml::type_config>::report_error
                    ((context<toml::type_config> *)in_stack_fffffffffffff060,
                     (error_info *)in_stack_fffffffffffff058);
          error_info::~error_info((error_info *)in_stack_fffffffffffff060);
        }
        bVar2 = result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
                ::is_ok(&local_828);
        in_stack_fffffffffffff0cf = false;
        if (bVar2) {
          local_920.region_.first_line_ = (size_t)&PTR_s__workspace_llm4binary_github_lic_009333b8;
          in_stack_fffffffffffff0c0._M_impl =
               (__impl *)
               result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
               ::unwrap((result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
                         *)in_stack_fffffffffffff0b8,in_stack_fffffffffffff0c0);
          in_stack_fffffffffffff0cf =
               std::
               optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::has_value((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)0x66ac67);
        }
        local_920.region_.first_column_._7_1_ = in_stack_fffffffffffff0cf;
        if ((bool)in_stack_fffffffffffff0cf != false) {
          local_2f4[0].fmt = multiline;
          basic_value<toml::type_config>::comments
                    ((basic_value<toml::type_config> *)(local_7b8 + 0xa0));
          local_920.region_.first_ = (size_t)&PTR_s__workspace_llm4binary_github_lic_009333d0;
          in_stack_fffffffffffff0b8 =
               (result<toml::basic_value<toml::type_config>,_toml::error_info> *)
               result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
               ::unwrap((result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
                         *)in_stack_fffffffffffff0b8,in_stack_fffffffffffff0c0);
          std::
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::value((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)in_stack_fffffffffffff060);
          preserve_comments::push_back
                    ((preserve_comments *)in_stack_fffffffffffff060,
                     (string *)in_stack_fffffffffffff058);
        }
        if ((local_321 & 1) != 0) {
          skip_multiline_spacer<toml::type_config>
                    (in_stack_fffffffffffff368,in_stack_fffffffffffff360,
                     (bool)in_stack_fffffffffffff35f);
          std::optional<toml::detail::multiline_spacer<toml::type_config>_>::operator=
                    ((optional<toml::detail::multiline_spacer<toml::type_config>_> *)
                     in_stack_fffffffffffff060,
                     (optional<toml::detail::multiline_spacer<toml::type_config>_> *)
                     in_stack_fffffffffffff058);
          std::optional<toml::detail::multiline_spacer<toml::type_config>_>::~optional
                    ((optional<toml::detail::multiline_spacer<toml::type_config>_> *)0x66ad45);
          bVar2 = std::optional<toml::detail::multiline_spacer<toml::type_config>_>::has_value
                            ((optional<toml::detail::multiline_spacer<toml::type_config>_> *)
                             0x66ad52);
          if ((bVar2) &&
             (in_stack_fffffffffffff0a0 =
                   std::optional<toml::detail::multiline_spacer<toml::type_config>_>::value
                             ((optional<toml::detail::multiline_spacer<toml::type_config>_> *)
                              in_stack_fffffffffffff060),
             (in_stack_fffffffffffff0a0->newline_found & 1U) != 0)) {
            local_2f4[0].fmt = multiline;
          }
        }
        std::
        vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
        ::push_back((vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                     *)in_stack_fffffffffffff060,in_stack_fffffffffffff058);
        result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
        ::~result((result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
                   *)0x66ada4);
        basic_value<toml::type_config>::~basic_value
                  ((basic_value<toml::type_config> *)in_stack_fffffffffffff060);
LAB_0066aec7:
        local_2d0 = 0;
      }
      else {
        in_stack_fffffffffffff090 = local_18;
        in_stack_fffffffffffff098 =
             result<toml::basic_value<toml::type_config>,_toml::error_info>::unwrap_err
                       (in_stack_fffffffffffff0b8,in_stack_fffffffffffff0c0);
        in_stack_fffffffffffff088 = &local_920;
        error_info::error_info
                  ((error_info *)in_stack_fffffffffffff060,(error_info *)in_stack_fffffffffffff058);
        context<toml::type_config>::report_error
                  ((context<toml::type_config> *)in_stack_fffffffffffff060,
                   (error_info *)in_stack_fffffffffffff058);
        error_info::~error_info((error_info *)in_stack_fffffffffffff060);
        in_stack_fffffffffffff080 = (error_info *)location::get_location(local_10);
        skip_value<toml::type_config>
                  ((location *)in_stack_fffffffffffff0d0,
                   (context<toml::type_config> *)
                   CONCAT17(in_stack_fffffffffffff0cf,in_stack_fffffffffffff0c8));
        peVar8 = (error_info *)location::get_location(local_10);
        if (in_stack_fffffffffffff080 != peVar8) goto LAB_0066aec7;
        local_2d0 = 3;
      }
      result<toml::basic_value<toml::type_config>,_toml::error_info>::~result
                ((result<toml::basic_value<toml::type_config>,_toml::error_info> *)0x66aedf);
      if (local_2d0 != 0) break;
    }
    cVar3 = location::current((location *)in_stack_fffffffffffff058);
    if (cVar3 == ']') {
      location::advance(in_stack_fffffffffffff070,in_stack_fffffffffffff068);
      s = local_20;
      pvVar4 = context<toml::type_config>::errors((context<toml::type_config> *)local_18);
      psVar9 = (success_type *)
               std::vector<toml::error_info,_std::allocator<toml::error_info>_>::size(pvVar4);
      if (s == psVar9) {
        std::
        vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
        ::vector((vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                  *)in_stack_fffffffffffff060,
                 (vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                  *)s);
        CLI::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x66b2a6);
        region::region((region *)in_stack_fffffffffffff090,(location *)in_stack_fffffffffffff088,
                       (location *)in_stack_fffffffffffff080);
        fmt_00.closing_indent = in_stack_fffffffffffff100;
        fmt_00._0_8_ = in_stack_fffffffffffff0f8;
        basic_value<toml::type_config>::basic_value
                  (in_stack_fffffffffffff0e0,(array_type *)in_stack_fffffffffffff0d8,fmt_00,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffff0d0,
                   (region_type *)CONCAT17(in_stack_fffffffffffff0cf,in_stack_fffffffffffff0c8));
        ok<toml::basic_value<toml::type_config>>(in_stack_fffffffffffff148);
        result<toml::basic_value<toml::type_config>,_toml::error_info>::result
                  (in_stack_fffffffffffff060,s);
        success<toml::basic_value<toml::type_config>_>::~success
                  ((success<toml::basic_value<toml::type_config>_> *)0x66b354);
        basic_value<toml::type_config>::~basic_value
                  ((basic_value<toml::type_config> *)in_stack_fffffffffffff060);
        region::~region((region *)in_stack_fffffffffffff060);
        CLI::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffff070);
        std::
        vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
        ::~vector((vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                   *)in_stack_fffffffffffff070);
        local_2d0 = 1;
      }
      else {
        context<toml::type_config>::errors((context<toml::type_config> *)local_18);
        std::vector<toml::error_info,_std::allocator<toml::error_info>_>::back
                  ((vector<toml::error_info,_std::allocator<toml::error_info>_> *)
                   in_stack_fffffffffffff060);
        err<toml::error_info_const&>((error_info *)in_stack_fffffffffffff0b8);
        result<toml::basic_value<toml::type_config>,_toml::error_info>::result
                  (in_stack_fffffffffffff060,(failure_type *)s);
        failure<toml::error_info>::~failure((failure<toml::error_info> *)0x66b219);
        local_2d0 = 1;
      }
    }
    else {
      region::region((region *)in_stack_fffffffffffff0d0,
                     (location *)CONCAT17(in_stack_fffffffffffff0cf,in_stack_fffffffffffff0c8));
      source_location::source_location
                ((source_location *)in_stack_fffffffffffff0e0,in_stack_fffffffffffff0d8);
      region::~region((region *)in_stack_fffffffffffff060);
      in_stack_fffffffffffff070 = local_ae1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff0a0,(char *)in_stack_fffffffffffff098,
                 (allocator<char> *)in_stack_fffffffffffff090);
      source_location::source_location
                ((source_location *)in_stack_fffffffffffff060,
                 (source_location *)in_stack_fffffffffffff058);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff0a0,(char *)in_stack_fffffffffffff098,
                 (allocator<char> *)in_stack_fffffffffffff090);
      make_error_info<>(in_stack_fffffffffffff228,in_stack_fffffffffffff220,
                        in_stack_fffffffffffff218);
      in_stack_fffffffffffff060 =
           (result<toml::basic_value<toml::type_config>,_toml::error_info> *)
           ((long)&local_ae1[1].location_ + 1);
      err<toml::error_info>((error_info *)in_stack_fffffffffffff0b8);
      result<toml::basic_value<toml::type_config>,_toml::error_info>::result
                (in_stack_fffffffffffff060,(failure_type *)in_stack_fffffffffffff058);
      failure<toml::error_info>::~failure((failure<toml::error_info> *)0x66b034);
      error_info::~error_info((error_info *)in_stack_fffffffffffff060);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff060);
      std::allocator<char>::~allocator(local_b81);
      source_location::~source_location((source_location *)in_stack_fffffffffffff060);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff060);
      std::allocator<char>::~allocator((allocator<char> *)local_ae1);
      local_2d0 = 1;
      source_location::~source_location((source_location *)in_stack_fffffffffffff060);
    }
LAB_0066b431:
    std::optional<toml::detail::multiline_spacer<toml::type_config>_>::~optional
              ((optional<toml::detail::multiline_spacer<toml::type_config>_> *)0x66b43e);
    std::
    vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
    ::~vector((vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
               *)in_stack_fffffffffffff070);
  }
  location::~location((location *)in_stack_fffffffffffff060);
  return in_RDI;
}

Assistant:

result<basic_value<TC>, error_info>
parse_array(location& loc, context<TC>& ctx)
{
    const auto num_errors = ctx.errors().size();

    const auto first = loc;

    if(loc.eof() || loc.current() != '[')
    {
        auto src = source_location(region(loc));
        return err(make_error_info("toml::parse_array: "
                "The next token is not an array", std::move(src), "here"));
    }
    loc.advance();

    typename basic_value<TC>::array_type val;

    array_format_info fmt;
    fmt.fmt = array_format::oneline;
    fmt.indent_type = indent_char::none;

    auto spacer = skip_multiline_spacer(loc, ctx);
    if(spacer.has_value() && spacer.value().newline_found)
    {
        fmt.fmt = array_format::multiline;
    }

    bool comma_found = true;
    while( ! loc.eof())
    {
        if(loc.current() == location::char_type(']'))
        {
            if(spacer.has_value() && spacer.value().newline_found &&
                spacer.value().indent_type != indent_char::none)
            {
                fmt.indent_type    = spacer.value().indent_type;
                fmt.closing_indent = spacer.value().indent;
            }
            break;
        }

        if( ! comma_found)
        {
            auto src = source_location(region(loc));
            return err(make_error_info("toml::parse_array: "
                    "expected value-separator `,` or closing `]`",
                    std::move(src), "here"));
        }

        if(spacer.has_value() && spacer.value().newline_found &&
            spacer.value().indent_type != indent_char::none)
        {
            fmt.indent_type = spacer.value().indent_type;
            fmt.body_indent = spacer.value().indent;
        }

        if(auto elem_res = parse_value(loc, ctx))
        {
            auto elem = std::move(elem_res.unwrap());

            if(spacer.has_value()) // copy previous comments to value
            {
                elem.comments() = std::move(spacer.value().comments);
            }

            // parse spaces between a value and a comma
            // array = [
            //     42    , # the answer
            //       ^^^^
            //     3.14 # pi
            //   , 2.71 ^^^^
            // ^^
            spacer = skip_multiline_spacer(loc, ctx);
            if(spacer.has_value())
            {
                for(std::size_t i=0; i<spacer.value().comments.size(); ++i)
                {
                    elem.comments().push_back(std::move(spacer.value().comments.at(i)));
                }
                if(spacer.value().newline_found)
                {
                    fmt.fmt = array_format::multiline;
                }
            }

            comma_found = character(',').scan(loc).is_ok();

            // parse comment after a comma
            // array = [
            //     42    , # the answer
            //             ^^^^^^^^^^^^
            //     3.14 # pi
            //          ^^^^
            // ]
            auto com_res = parse_comment_line(loc, ctx);
            if(com_res.is_err())
            {
                ctx.report_error(com_res.unwrap_err());
            }

            const bool comment_found = com_res.is_ok() && com_res.unwrap().has_value();
            if(comment_found)
            {
                fmt.fmt = array_format::multiline;
                elem.comments().push_back(com_res.unwrap().value());
            }
            if(comma_found)
            {
                spacer = skip_multiline_spacer(loc, ctx, comment_found);
                if(spacer.has_value() && spacer.value().newline_found)
                {
                    fmt.fmt = array_format::multiline;
                }
            }
            val.push_back(std::move(elem));
        }
        else
        {
            // if err, push error to ctx and try recovery.
            ctx.report_error(std::move(elem_res.unwrap_err()));

            // if it looks like some value, then skip the value.
            // otherwise, it may be a new key-value pair or a new table and
            // the error is "missing closing ]". stop parsing.

            const auto before_skip = loc.get_location();
            skip_value(loc, ctx);
            if(before_skip == loc.get_location()) // cannot skip! break...
            {
                break;
            }
        }
    }

    if(loc.current() != ']')
    {
        auto src = source_location(region(loc));
        return err(make_error_info("toml::parse_array: missing closing bracket `]`",
            std::move(src), "expected `]`, reached EOF"));
    }
    else
    {
        loc.advance();
    }
    // any error reported from this function
    if(num_errors != ctx.errors().size())
    {
        assert(ctx.has_error()); // already reported
        return err(ctx.errors().back());
    }

    return ok(basic_value<TC>(
            std::move(val), std::move(fmt), {}, region(first, loc)
        ));
}